

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CrossSiteObject.h
# Opt level: O1

PropertyQueryFlags __thiscall
Js::CrossSiteObject<Js::JavascriptMap>::GetItemReferenceQuery
          (CrossSiteObject<Js::JavascriptMap> *this,Var originalInstance,uint32 index,Var *value,
          ScriptContext *requestContext)

{
  PropertyQueryFlags PVar1;
  Var pvVar2;
  
  pvVar2 = CrossSite::MarshalVar
                     ((((((this->super_JavascriptMap).super_DynamicObject.super_RecyclableObject.
                          type.ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
                      scriptContext.ptr,originalInstance,false);
  PVar1 = DynamicObject::GetItemReferenceQuery
                    ((DynamicObject *)this,pvVar2,index,value,requestContext);
  if (PVar1 == Property_Found) {
    pvVar2 = CrossSite::MarshalVar(requestContext,*value,false);
    *value = pvVar2;
  }
  return PVar1;
}

Assistant:

PropertyQueryFlags CrossSiteObject<T>::GetItemReferenceQuery(Var originalInstance, uint32 index, Var* value, ScriptContext * requestContext)
    {
        originalInstance = CrossSite::MarshalVar(this->GetScriptContext(), originalInstance);
        PropertyQueryFlags result = __super::GetItemReferenceQuery(originalInstance, index, value, requestContext);
        if (JavascriptConversion::PropertyQueryFlagsToBoolean(result))
        {
            *value = CrossSite::MarshalVar(requestContext, *value);
        }
        return result;
    }